

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O1

xmlXIncludeRefPtr xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr node)

{
  xmlElementType xVar1;
  _xmlDoc *p_Var2;
  xmlDictPtr dict;
  _xmlNode *fallback;
  xmlDoc *doc;
  xmlHashTablePtr hash;
  _xmlDtd *p_Var3;
  xmlNodeSetPtr pxVar4;
  byte bVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  xmlChar *pxVar9;
  xmlChar *pxVar10;
  xmlXPathObjectPtr obj;
  xmlNodePtr pxVar11;
  xmlNodePtr copy;
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr value;
  xmlXPathContextPtr ctxt_01;
  xmlXIncludeRefPtr ref;
  xmlXIncludeDoc *pxVar12;
  xmlChar *pxVar13;
  xmlNodePtr pxVar14;
  _xmlDtd *p_Var15;
  xmlXIncludeRefPtr *ppxVar16;
  char *pcVar17;
  long lVar18;
  xmlDocPtr cur;
  xmlXIncludeRefPtr pxVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  xmlChar *base;
  xmlURIPtr uri;
  _xmlDoc *local_88;
  xmlChar *local_78;
  xmlChar *local_70;
  xmlDoc *local_68;
  xmlXIncludeCtxtPtr local_60;
  long local_58;
  int local_4c;
  xmlXIncludeRefPtr *local_48;
  xmlDocPtr local_40;
  int *local_38;
  
  if (ctxt->fatalErr != 0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  if (0x27 < ctxt->depth) {
    xmlXIncludeErr(ctxt,node,0x640,"maximum recursion depth exceeded\n",(xmlChar *)0x0);
    ctxt->fatalErr = 1;
    return (xmlXIncludeRefPtr)0x0;
  }
  if (0 < (long)ctxt->incNr) {
    lVar18 = 0;
    do {
      pxVar19 = ctxt->incTab[lVar18];
      if (pxVar19->elem == node) {
        if (pxVar19->expanding != 0) {
          xmlXIncludeErr(ctxt,node,0x640,"inclusion loop detected\n",(xmlChar *)0x0);
          return (xmlXIncludeRefPtr)0x0;
        }
        return pxVar19;
      }
      lVar18 = lVar18 + 1;
    } while (ctxt->incNr != lVar18);
  }
  pxVar19 = (xmlXIncludeRefPtr)0x0;
  local_68 = (xmlDoc *)0x0;
  local_78 = (xmlChar *)0x0;
  if (node != (xmlNodePtr)0x0) {
    local_88 = (_xmlDoc *)xmlXIncludeGetProp(ctxt,node,(xmlChar *)"xpointer");
    pxVar9 = xmlXIncludeGetProp(ctxt,node,"href");
    if (pxVar9 == (xmlChar *)0x0) {
      if (local_88 == (_xmlDoc *)0x0) {
        pxVar9 = (xmlChar *)0x0;
        xmlXIncludeErr(ctxt,node,0x643,"href or xpointer must be present\n",(xmlChar *)0x0);
        pxVar10 = (xmlChar *)0x0;
        local_88 = (_xmlDoc *)0x0;
      }
      else {
        pxVar9 = xmlStrdup("");
        if (pxVar9 != (xmlChar *)0x0) goto LAB_001b95b4;
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        pxVar9 = (xmlChar *)0x0;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        pxVar10 = (xmlChar *)0x0;
      }
LAB_001b96e7:
      ref = (xmlXIncludeRefPtr)0x0;
LAB_001b96ea:
      pxVar19 = ref;
      ref = (xmlXIncludeRefPtr)0x0;
    }
    else {
      iVar7 = xmlStrlen(pxVar9);
      if (2000 < iVar7) {
        pcVar17 = "URI too long\n";
        pxVar10 = (xmlChar *)0x0;
        iVar7 = 0x645;
        pxVar13 = (xmlChar *)0x0;
LAB_001b96e2:
        xmlXIncludeErr(ctxt,node,iVar7,pcVar17,pxVar13);
        goto LAB_001b96e7;
      }
LAB_001b95b4:
      pxVar10 = xmlXIncludeGetProp(ctxt,node,(xmlChar *)"parse");
      iVar7 = 1;
      bVar5 = 1;
      if ((pxVar10 != (xmlChar *)0x0) && (iVar8 = xmlStrEqual(pxVar10,(xmlChar *)"xml"), iVar8 == 0)
         ) {
        iVar8 = xmlStrEqual(pxVar10,"text");
        bVar5 = 0;
        iVar7 = 0;
        if (iVar8 == 0) {
          pcVar17 = "invalid value %s for \'parse\'\n";
          iVar7 = 0x641;
          pxVar13 = pxVar10;
          goto LAB_001b96e2;
        }
      }
      iVar8 = xmlParseURISafe((char *)pxVar9,(xmlURIPtr *)&local_68);
      pxVar13 = pxVar9;
      if (local_68 == (xmlDoc *)0x0) {
        if (iVar8 < 0) goto LAB_001b9b51;
        pcVar17 = "invalid value href %s\n";
        iVar7 = 0x645;
        goto LAB_001b96e2;
      }
      p_Var2 = local_68->doc;
      if (p_Var2 != (_xmlDoc *)0x0) {
        if (ctxt->legacy == 0) {
          pcVar17 = "Invalid fragment identifier in URI %s use the xpointer attribute\n";
          iVar7 = 0x652;
          goto LAB_001b96e2;
        }
        if (local_88 != (_xmlDoc *)0x0) {
          (*xmlFree)(p_Var2);
          p_Var2 = local_88;
        }
        local_88 = p_Var2;
        local_68->doc = (_xmlDoc *)0x0;
      }
      local_70 = xmlSaveUri((xmlURIPtr)local_68);
      if (local_70 == (xmlChar *)0x0) {
LAB_001b9b51:
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        ref = (xmlXIncludeRefPtr)0x0;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
        goto LAB_001b96ea;
      }
      (*xmlFree)(pxVar9);
      pxVar9 = local_70;
      iVar8 = xmlNodeGetBaseSafe(ctxt->doc,node,&local_78);
      if (iVar8 < 0) goto LAB_001b9b51;
      if (*pxVar9 != '\0') {
        iVar8 = xmlBuildURISafe(pxVar9,local_78,&local_70);
        if (iVar8 < 0) {
LAB_001b9c2c:
          xmlXIncludeErrMemory(ctxt);
          goto LAB_001b96e7;
        }
        if (local_70 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar9);
          pxVar9 = local_70;
          iVar8 = xmlStrEqual(local_70,ctxt->doc->URL);
          bVar23 = iVar8 != 0;
          goto LAB_001b9b83;
        }
        ref = (xmlXIncludeRefPtr)0x0;
        xmlXIncludeErr(ctxt,node,0x645,"failed build URL\n",(xmlChar *)0x0);
        goto LAB_001b96ea;
      }
      bVar23 = true;
LAB_001b9b83:
      if (((bool)(bVar5 & bVar23)) &&
         ((local_88 == (_xmlDoc *)0x0 || (*(char *)&local_88->_private == '\0')))) {
        pcVar17 = "detected a local recursion with no xpointer in %s\n";
        iVar7 = 0x640;
        pxVar13 = pxVar9;
        goto LAB_001b96e2;
      }
      ref = (xmlXIncludeRefPtr)(*xmlMalloc)(0x38);
      if (ref == (xmlXIncludeRefPtr)0x0) goto LAB_001b9c2c;
      ref->base = (xmlChar *)0x0;
      ref->elem = (xmlNodePtr)0x0;
      ref->inc = (xmlNodePtr)0x0;
      ref->xml = 0;
      ref->fallback = 0;
      ref->URI = (xmlChar *)0x0;
      ref->fragment = (xmlChar *)0x0;
      ref->expanding = 0;
      ref->replace = 0;
      ref->elem = node;
      ref->xml = iVar7;
      ref->URI = pxVar9;
      ref->fragment = (xmlChar *)local_88;
      if ((((ctxt->parseFlags & 0x40000) != 0) || (node->doc == (_xmlDoc *)0x0)) ||
         ((node->doc->parseFlags & 0x40000) != 0)) {
LAB_001ba147:
        iVar7 = ctxt->incMax;
        if (iVar7 <= ctxt->incNr) {
          if (iVar7 < 1) {
            uVar20 = 4;
          }
          else {
            uVar20 = 0xffffffff;
            if (iVar7 < 1000000000) {
              uVar21 = iVar7 + 1U >> 1;
              uVar20 = uVar21 + iVar7;
              if ((int)(1000000000 - uVar21) < iVar7) {
                uVar20 = 1000000000;
              }
            }
          }
          if (((int)uVar20 < 0) ||
             (ppxVar16 = (xmlXIncludeRefPtr *)(*xmlRealloc)(ctxt->incTab,(ulong)uVar20 << 3),
             ppxVar16 == (xmlXIncludeRefPtr *)0x0)) goto LAB_001ba1c6;
          ctxt->incTab = ppxVar16;
          ctxt->incMax = uVar20;
        }
        iVar7 = ctxt->incNr;
        ctxt->incNr = iVar7 + 1;
        ctxt->incTab[iVar7] = ref;
        pxVar9 = (xmlChar *)0x0;
        local_88 = (_xmlDoc *)0x0;
        goto LAB_001b96ea;
      }
      if (local_78 != (xmlChar *)0x0) {
        ref->base = local_78;
        local_78 = (xmlChar *)0x0;
        goto LAB_001ba147;
      }
      pxVar9 = xmlStrdup("");
      ref->base = pxVar9;
      if (pxVar9 != (xmlChar *)0x0) goto LAB_001ba147;
LAB_001ba1c6:
      xmlXIncludeErrMemory(ctxt);
      pxVar9 = (xmlChar *)0x0;
      local_88 = (_xmlDoc *)0x0;
      pxVar19 = (xmlXIncludeRefPtr)0x0;
    }
    xmlXIncludeFreeRef(ref);
    xmlFreeURI((xmlURIPtr)local_68);
    (*xmlFree)(pxVar9);
    (*xmlFree)(pxVar10);
    (*xmlFree)(local_88);
    (*xmlFree)(local_78);
  }
  if (pxVar19 == (xmlXIncludeRefPtr)0x0) {
    return (xmlXIncludeRefPtr)0x0;
  }
  pxVar19->expanding = 1;
  ctxt->depth = ctxt->depth + 1;
  pxVar14 = pxVar19->elem;
  if (pxVar14 == (xmlNodePtr)0x0) goto LAB_001b9cf6;
  if (pxVar19->xml == 0) {
    iVar7 = xmlXIncludeLoadTxt(ctxt,pxVar19);
    if (-1 < iVar7) goto LAB_001b9cf6;
  }
  else {
    pxVar9 = pxVar19->URI;
    pxVar10 = pxVar19->fragment;
    if (((*pxVar9 == '\0') || (*pxVar9 == '#')) ||
       ((ctxt->doc != (xmlDocPtr)0x0 && (iVar7 = xmlStrEqual(pxVar9,ctxt->doc->URL), iVar7 != 0))))
    {
      cur = ctxt->doc;
LAB_001b9791:
      if (pxVar10 == (xmlChar *)0x0) {
        pxVar11 = xmlDocGetRootElement(cur);
        if (pxVar11 == (xmlNodePtr)0x0) {
          pxVar11 = pxVar19->elem;
          pcVar17 = "document without root\n";
          iVar7 = 1;
          goto LAB_001b9c5c;
        }
        copy = xmlDocCopyNode(pxVar11,ctxt->doc,1);
        pxVar19->inc = copy;
        if (copy != (xmlNodePtr)0x0) {
          if (pxVar19->base != (xmlChar *)0x0) {
            xmlXIncludeBaseFixup(ctxt,pxVar11,copy,pxVar19->base);
          }
          goto LAB_001b9cf6;
        }
LAB_001b99f2:
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if ((ctxt->isStream == 0) || (cur != ctxt->doc)) {
          if (ctxt->xpctxt == (xmlXPathContextPtr)0x0) {
            ctxt_01 = xmlXPathNewContext(cur);
            ctxt->xpctxt = ctxt_01;
            if (ctxt_01 == (xmlXPathContextPtr)0x0) goto LAB_001b99f2;
            if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
              xmlXPathSetErrorHandler(ctxt_01,ctxt->errorHandler,ctxt->errorCtxt);
            }
          }
          else {
            ctxt->xpctxt->doc = cur;
          }
          obj = xmlXPtrEval(pxVar10,ctxt->xpctxt);
          iVar7 = (ctxt->xpctxt->lastError).code;
          if (iVar7 == 0) {
            if (obj == (xmlXPathObjectPtr)0x0) goto LAB_001b9cf6;
            if ((XPATH_XSLT_TREE < obj->type) || ((0x31dU >> (obj->type & 0x1f) & 1) == 0)) {
              pxVar4 = obj->nodesetval;
              if ((pxVar4 != (xmlNodeSetPtr)0x0) && (0 < (long)pxVar4->nodeNr)) {
                lVar18 = 0;
                do {
                  if ((pxVar4->nodeTab[lVar18] != (xmlNodePtr)0x0) &&
                     (xVar1 = pxVar4->nodeTab[lVar18]->type,
                     xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE))) {
                    if ((0x1bdc00U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
                      if (xVar1 == XML_ATTRIBUTE_NODE) {
                        pxVar14 = pxVar19->elem;
                        pcVar17 = "XPointer selects an attribute: #%s\n";
                      }
                      else {
                        if (xVar1 != XML_NAMESPACE_DECL) goto LAB_001ba000;
                        pxVar14 = pxVar19->elem;
                        pcVar17 = "XPointer selects a namespace: #%s\n";
                      }
                    }
                    else {
                      pxVar14 = pxVar19->elem;
                      pcVar17 = "XPointer selects unexpected nodes: #%s\n";
                    }
                    xmlXIncludeErr(ctxt,pxVar14,0x64d,pcVar17,pxVar10);
                    goto LAB_001ba1fc;
                  }
LAB_001ba000:
                  lVar18 = lVar18 + 1;
                } while (pxVar4->nodeNr != lVar18);
              }
              pxVar14 = xmlXIncludeCopyXPointer(ctxt,obj,pxVar19->base);
              pxVar19->inc = pxVar14;
LAB_001ba1fc:
              xmlXPathFreeObject(obj);
              goto LAB_001b9cf6;
            }
            xmlXIncludeErr(ctxt,pxVar19->elem,0x64d,"XPointer is not a range: #%s\n",pxVar10);
            xmlXPathFreeObject(obj);
            goto LAB_001b9c64;
          }
          if (iVar7 == 2) goto LAB_001b99f2;
          pxVar11 = pxVar19->elem;
          pcVar17 = "XPointer evaluation failed: #%s\n";
          iVar7 = 0x64c;
        }
        else {
          pxVar11 = pxVar19->elem;
          pcVar17 = "XPointer expressions not allowed in streaming mode\n";
          iVar7 = 0x64c;
LAB_001b9c5c:
          pxVar10 = (xmlChar *)0x0;
        }
        xmlXIncludeErr(ctxt,pxVar11,iVar7,pcVar17,pxVar10);
      }
    }
    else {
      if (0 < ctxt->urlNr) {
        lVar22 = 0;
        lVar18 = 0;
        do {
          iVar7 = xmlStrEqual(pxVar9,*(xmlChar **)((long)&ctxt->urlTab->url + lVar22));
          if (iVar7 != 0) {
            if (*(int *)((long)&ctxt->urlTab->expanding + lVar22) != 0) {
              pxVar11 = pxVar19->elem;
              pcVar17 = "inclusion loop detected\n";
              iVar7 = 0x640;
              goto LAB_001b9c5c;
            }
            cur = *(xmlDocPtr *)((long)&ctxt->urlTab->doc + lVar22);
            if (cur != (xmlDoc *)0x0) goto LAB_001b9791;
            goto LAB_001b9c64;
          }
          lVar18 = lVar18 + 1;
          lVar22 = lVar22 + 0x18;
        } while (lVar18 < ctxt->urlNr);
      }
      uVar20 = ctxt->parseFlags;
      if (pxVar10 != (xmlChar *)0x0) {
        ctxt->parseFlags = uVar20 | 2;
      }
      xmlInitParser();
      ctxt_00 = xmlNewParserCtxt();
      if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        cur = (xmlDocPtr)0x0;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if (ctxt->errorHandler != (xmlStructuredErrorFunc)0x0) {
          xmlCtxtSetErrorHandler(ctxt_00,ctxt->errorHandler,ctxt->errorCtxt);
        }
        if (ctxt->resourceLoader != (xmlResourceLoader)0x0) {
          xmlCtxtSetResourceLoader(ctxt_00,ctxt->resourceLoader,ctxt->resourceCtxt);
        }
        local_58 = CONCAT44(local_58._4_4_,uVar20);
        ctxt_00->_private = ctxt->_private;
        if ((ctxt->doc != (xmlDocPtr)0x0) && (ctxt->doc->dict != (_xmlDict *)0x0)) {
          if (ctxt_00->dict != (xmlDictPtr)0x0) {
            xmlDictFree(ctxt_00->dict);
          }
          dict = ctxt->doc->dict;
          ctxt_00->dict = dict;
          xmlDictReference(dict);
        }
        xmlCtxtUseOptions(ctxt_00,ctxt->parseFlags | 4);
        cur = (xmlDocPtr)0x0;
        value = xmlLoadResource(ctxt_00,(char *)pxVar9,(char *)0x0,XML_RESOURCE_XINCLUDE);
        if (value != (xmlParserInputPtr)0x0) {
          iVar7 = xmlCtxtPushInput(ctxt_00,value);
          if (iVar7 < 0) {
            xmlFreeInputStream(value);
          }
          else {
            xmlParseDocument(ctxt_00);
            cur = ctxt_00->myDoc;
            if (ctxt_00->wellFormed != 0) goto LAB_001b9db2;
            if (cur != (xmlDocPtr)0x0) {
              xmlFreeDoc(cur);
            }
            ctxt_00->myDoc = (xmlDocPtr)0x0;
          }
          cur = (xmlDocPtr)0x0;
        }
LAB_001b9db2:
        iVar7 = xmlCtxtIsCatastrophicError(ctxt_00);
        if (iVar7 != 0) {
          xmlXIncludeErr(ctxt,(xmlNodePtr)0x0,ctxt_00->errNo,"parser error",(xmlChar *)0x0);
        }
        xmlFreeParserCtxt(ctxt_00);
        uVar20 = (uint)local_58;
      }
      ctxt->parseFlags = uVar20;
      iVar7 = ctxt->urlMax;
      if (ctxt->urlNr < iVar7) {
LAB_001b9e5b:
        pxVar12 = ctxt->urlTab;
        iVar7 = ctxt->urlNr;
        pxVar12[iVar7].doc = cur;
        pxVar13 = xmlStrdup(pxVar9);
        pxVar12[iVar7].url = pxVar13;
        if (pxVar13 != (xmlChar *)0x0) {
          pxVar12[iVar7].expanding = 0;
          iVar8 = ctxt->urlNr;
          ctxt->urlNr = iVar8 + 1;
          if (cur == (xmlDocPtr)0x0) goto LAB_001b9c64;
          local_58 = (long)iVar8;
          if (cur->URL != (xmlChar *)0x0) {
            xmlStrEqual(pxVar9,cur->URL);
          }
          local_38 = &ctxt->incNr;
          if (cur->intSubset != (_xmlDtd *)0x0) {
            doc = ctxt->doc;
            p_Var15 = doc->intSubset;
            if (p_Var15 == (_xmlDtd *)0x0) {
              pxVar11 = xmlDocGetRootElement(doc);
              if (pxVar11 != (xmlNodePtr)0x0) {
                p_Var15 = xmlCreateIntSubset(doc,pxVar11->name,(xmlChar *)0x0,(xmlChar *)0x0);
                if (p_Var15 != (xmlDtdPtr)0x0) goto LAB_001b9ede;
                ctxt->fatalErr = 1;
                ctxt->errNo = 2;
                ctxt->nbErrors = ctxt->nbErrors + 1;
                xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                    (xmlError *)0x0);
              }
            }
            else {
LAB_001b9ede:
              if ((cur->intSubset != (_xmlDtd *)0x0) &&
                 (hash = (xmlHashTablePtr)cur->intSubset->entities, hash != (xmlHashTablePtr)0x0)) {
                local_68 = doc;
                local_60 = ctxt;
                xmlHashScan(hash,xmlXIncludeMergeEntity,&local_68);
              }
              p_Var3 = cur->extSubset;
              if ((((p_Var3 != (_xmlDtd *)0x0) && (p_Var3->entities != (void *)0x0)) &&
                  (local_68 = doc, local_60 = ctxt,
                  iVar8 = xmlStrEqual(p_Var15->ExternalID,p_Var3->ExternalID), iVar8 == 0)) &&
                 (iVar8 = xmlStrEqual(p_Var15->SystemID,p_Var3->SystemID), iVar8 == 0)) {
                xmlHashScan((xmlHashTablePtr)p_Var3->entities,xmlXIncludeMergeEntity,&local_68);
              }
            }
          }
          piVar6 = local_38;
          pxVar12[iVar7].expanding = 1;
          local_40 = ctxt->doc;
          iVar7 = ctxt->incMax;
          iVar8 = ctxt->incNr;
          local_48 = ctxt->incTab;
          local_4c = ctxt->isStream;
          ctxt->doc = cur;
          ctxt->isStream = 0;
          local_38[0] = 0;
          local_38[1] = 0;
          *(xmlXIncludeRefPtr **)(local_38 + 2) = (xmlXIncludeRefPtr *)0x0;
          pxVar11 = xmlDocGetRootElement(cur);
          xmlXIncludeDoProcess(ctxt,pxVar11);
          if (ctxt->incTab != (xmlXIncludeRefPtr *)0x0) {
            if (0 < *piVar6) {
              lVar18 = 0;
              do {
                xmlXIncludeFreeRef(ctxt->incTab[lVar18]);
                lVar18 = lVar18 + 1;
              } while (lVar18 < ctxt->incNr);
            }
            (*xmlFree)(ctxt->incTab);
          }
          ctxt->doc = local_40;
          ctxt->incMax = iVar7;
          ctxt->incNr = iVar8;
          ctxt->incTab = local_48;
          ctxt->isStream = local_4c;
          ctxt->urlTab[local_58].expanding = 0;
          goto LAB_001b9791;
        }
        ctxt->fatalErr = 1;
        ctxt->errNo = 2;
        ctxt->nbErrors = ctxt->nbErrors + 1;
        xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                            (xmlError *)0x0);
      }
      else {
        if (iVar7 < 1) {
          uVar20 = 8;
        }
        else {
          uVar20 = 0xffffffff;
          if (iVar7 < 1000000000) {
            uVar21 = iVar7 + 1U >> 1;
            uVar20 = uVar21 + iVar7;
            if ((int)(1000000000 - uVar21) < iVar7) {
              uVar20 = 1000000000;
            }
          }
        }
        if ((-1 < (int)uVar20) &&
           (pxVar12 = (xmlXIncludeDoc *)(*xmlRealloc)(ctxt->urlTab,(ulong)uVar20 * 0x18),
           pxVar12 != (xmlXIncludeDoc *)0x0)) {
          ctxt->urlMax = uVar20;
          ctxt->urlTab = pxVar12;
          goto LAB_001b9e5b;
        }
        xmlXIncludeErrMemory(ctxt);
      }
      xmlFreeDoc(cur);
    }
  }
LAB_001b9c64:
  for (fallback = pxVar14->children; fallback != (xmlNodePtr)0x0; fallback = fallback->next) {
    if ((((fallback->type == XML_ELEMENT_NODE) && (fallback->ns != (xmlNs *)0x0)) &&
        (iVar7 = xmlStrEqual(fallback->name,(xmlChar *)"fallback"), iVar7 != 0)) &&
       ((iVar7 = xmlStrEqual(fallback->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar7 != 0 ||
        (iVar7 = xmlStrEqual(fallback->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar7 != 0)))) {
      iVar7 = xmlXIncludeLoadFallback(ctxt,fallback,pxVar19);
      if (-1 < iVar7) goto LAB_001b9cf6;
      break;
    }
  }
  xmlXIncludeErr(ctxt,pxVar14,0x644,"could not load %s, and no fallback was found\n",pxVar19->URI);
LAB_001b9cf6:
  ctxt->depth = ctxt->depth + -1;
  pxVar19->expanding = 0;
  return pxVar19;
}

Assistant:

static xmlXIncludeRefPtr
xmlXIncludeExpandNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr node) {
    xmlXIncludeRefPtr ref;
    int i;

    if (ctxt->fatalErr)
        return(NULL);
    if (ctxt->depth >= XINCLUDE_MAX_DEPTH) {
        xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                       "maximum recursion depth exceeded\n", NULL);
        ctxt->fatalErr = 1;
        return(NULL);
    }

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    /*
     * The XInclude engine offers no protection against exponential
     * expansion attacks similar to "billion laughs". Avoid timeouts by
     * limiting the total number of replacements when fuzzing.
     *
     * Unfortuately, a single XInclude can already result in quadratic
     * behavior:
     *
     *     <doc xmlns:xi="http://www.w3.org/2001/XInclude">
     *       <xi:include xpointer="xpointer(//e)"/>
     *       <e>
     *         <e>
     *           <e>
     *             <!-- more nested elements -->
     *           </e>
     *         </e>
     *       </e>
     *     </doc>
     */
    if (ctxt->incTotal >= 20)
        return(NULL);
    ctxt->incTotal++;
#endif

    for (i = 0; i < ctxt->incNr; i++) {
        if (ctxt->incTab[i]->elem == node) {
            if (ctxt->incTab[i]->expanding) {
                xmlXIncludeErr(ctxt, node, XML_XINCLUDE_RECURSION,
                               "inclusion loop detected\n", NULL);
                return(NULL);
            }
            return(ctxt->incTab[i]);
        }
    }

    ref = xmlXIncludeAddNode(ctxt, node);
    if (ref == NULL)
        return(NULL);
    ref->expanding = 1;
    ctxt->depth++;
    xmlXIncludeLoadNode(ctxt, ref);
    ctxt->depth--;
    ref->expanding = 0;

    return(ref);
}